

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O3

Result wabt::GenerateNames(Module *module)

{
  pointer *ppbVar1;
  Import *pIVar2;
  pointer ppEVar3;
  Export *__rhs;
  string *psVar4;
  pointer pTVar5;
  pointer pTVar6;
  DelegateNop DVar7;
  Index IVar8;
  Result RVar9;
  long *plVar10;
  Func *pFVar11;
  undefined1 auVar12 [8];
  long lVar13;
  size_type *psVar14;
  pointer pbVar15;
  long lVar16;
  pointer ppIVar17;
  ulong uVar18;
  ulong uVar19;
  char *prefix;
  long lVar20;
  pointer ppEVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  pointer local_110;
  Delegate local_108;
  NameGenerator generator;
  undefined1 auStack_88 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  undefined1 local_60 [8];
  string new_name;
  BindingHash *local_38;
  
  local_108._vptr_Delegate = (_func_int **)&PTR__NameGenerator_01545f28;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&generator.module_,&local_108);
  generator.num_table_imports_ = 0;
  generator.num_memory_imports_ = 0;
  generator.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generator.label_count_ = 0;
  generator.num_func_imports_ = 0;
  ppIVar17 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_110 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  generator._112_8_ = module;
  if (ppIVar17 != local_110) {
    ppbVar1 = &index_to_name.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pIVar2 = *ppIVar17;
      switch(pIVar2->kind_) {
      case First:
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0);
        new_name.field_2._8_8_ =
             ZEXT48(generator.visitor_.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        generator.visitor_.expr_iter_stack_.
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                               generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        break;
      case Table:
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290);
        new_name.field_2._8_8_ = generator._96_8_ & 0xffffffff;
        generator.label_count_ = generator.label_count_ + 1;
        break;
      case Memory:
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8);
        new_name.field_2._8_8_ = ZEXT48(generator.num_func_imports_);
        generator.num_func_imports_ = generator.num_func_imports_ + 1;
        break;
      case Global:
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8);
        new_name.field_2._8_8_ = generator._104_8_ & 0xffffffff;
        generator.num_table_imports_ = generator.num_table_imports_ + 1;
        break;
      case Except:
        local_38 = (BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178);
        new_name.field_2._8_8_ = ZEXT48(generator.num_memory_imports_);
        generator.num_memory_imports_ = generator.num_memory_imports_ + 1;
        break;
      default:
        goto switchD_00f45d59_default;
      }
      if ((int)new_name.field_2._8_8_ == -1) {
        __assert_fail("index != kInvalidIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/generate-names.cc"
                      ,0x148,
                      "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
      }
      std::operator+(&local_130,'$',&pIVar2->module_name);
      plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((string *)&local_130,local_130._M_string_length,0,1,'.');
      pbVar15 = (pointer)(plVar10 + 2);
      if ((pointer)*plVar10 == pbVar15) {
        index_to_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar15->_M_dataplus)._M_p;
        index_to_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar10[3];
        auStack_88 = (undefined1  [8])ppbVar1;
      }
      else {
        index_to_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pbVar15->_M_dataplus)._M_p;
        auStack_88 = (undefined1  [8])*plVar10;
      }
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar10[1];
      *plVar10 = (long)pbVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((string *)auStack_88,(pIVar2->field_name)._M_dataplus._M_p,
                                   (pIVar2->field_name)._M_string_length);
      local_60 = (undefined1  [8])&new_name._M_string_length;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        new_name._M_string_length = *psVar14;
        new_name.field_2._M_allocated_capacity = plVar10[3];
      }
      else {
        new_name._M_string_length = *psVar14;
        local_60 = (undefined1  [8])*plVar10;
      }
      new_name._M_dataplus._M_p = (pointer)plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if (auStack_88 != (undefined1  [8])ppbVar1) {
        operator_delete((void *)auStack_88);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      anon_unknown_16::NameGenerator::MaybeUseAndBindName
                (local_38,(char *)local_60,(Index)new_name.field_2._8_8_,(string *)(pIVar2 + 1));
      module = (Module *)generator._112_8_;
      if (local_60 != (undefined1  [8])&new_name._M_string_length) {
        operator_delete((void *)local_60);
      }
switchD_00f45d59_default:
      ppIVar17 = ppIVar17 + 1;
    } while (ppIVar17 != local_110);
  }
  ppEVar3 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar20 = generator._112_8_;
  for (ppEVar21 = (module->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; generator._112_8_ = lVar20, ppEVar21 != ppEVar3;
      ppEVar21 = ppEVar21 + 1) {
    __rhs = *ppEVar21;
    switch(__rhs->kind) {
    case First:
      pFVar11 = Module::GetFunc((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                &__rhs->var);
      if (pFVar11 != (Func *)0x0) {
        IVar8 = Module::GetFuncIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        new_name.field_2._8_8_ = 0x1b0;
LAB_00f46097:
        DVar7.super_Delegate._vptr_Delegate =
             generator.super_DelegateNop.super_Delegate._vptr_Delegate;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,'$',&__rhs->name);
        anon_unknown_16::NameGenerator::MaybeUseAndBindName
                  ((BindingHash *)
                   ((long)DVar7.super_Delegate._vptr_Delegate + new_name.field_2._8_8_),
                   (char *)local_60,IVar8,&pFVar11->name);
        if (local_60 != (undefined1  [8])&new_name._M_string_length) {
          operator_delete((void *)local_60);
        }
      }
      break;
    case Table:
      pFVar11 = (Func *)Module::GetTable((Module *)
                                         generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                         &__rhs->var);
      if (pFVar11 != (Func *)0x0) {
        IVar8 = Module::GetTableIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        new_name.field_2._8_8_ = 0x290;
        goto LAB_00f46097;
      }
      break;
    case Memory:
      pFVar11 = (Func *)Module::GetMemory((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar11 != (Func *)0x0) {
        IVar8 = Module::GetMemoryIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        new_name.field_2._8_8_ = 0x2c8;
        goto LAB_00f46097;
      }
      break;
    case Global:
      pFVar11 = (Func *)Module::GetGlobal((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar11 != (Func *)0x0) {
        IVar8 = Module::GetGlobalIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        new_name.field_2._8_8_ = 0x1e8;
        goto LAB_00f46097;
      }
      break;
    case Except:
      pFVar11 = (Func *)Module::GetExcept((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
      if (pFVar11 != (Func *)0x0) {
        IVar8 = Module::GetExceptIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        new_name.field_2._8_8_ = 0x178;
        goto LAB_00f46097;
      }
    }
    lVar20 = generator._112_8_;
  }
  lVar13 = *(long *)(lVar20 + 0xa0);
  lVar16 = *(long *)(lVar20 + 0xa8);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8),"$g",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0xa0);
        lVar16 = *(long *)(lVar20 + 0xa8);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0xe8);
  lVar16 = *(long *)(lVar20 + 0xf0);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 600),"$t",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0xe8);
        lVar16 = *(long *)(lVar20 + 0xf0);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x88);
  if (*(long *)(lVar20 + 0x90) != lVar13) {
    uVar18 = 0;
    do {
      pFVar11 = *(Func **)(lVar13 + uVar18 * 8);
      if ((pFVar11->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0),"$f",
                   (Index)uVar18,&pFVar11->name);
      }
      auStack_88 = (undefined1  [8])0x0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar5 = (pFVar11->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar6 = (pFVar11->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      IVar8 = LocalTypes::size(&pFVar11->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)(IVar8 + (int)((ulong)((long)pTVar6 - (long)pTVar5) >> 2)),
                 &pFVar11->bindings,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_88);
      if ((undefined1  [8])
          index_to_name.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_88) {
        lVar20 = 0;
        uVar19 = 0;
        auVar12 = auStack_88;
        pbVar15 = index_to_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (*(long *)((long)&((pointer)auVar12)->_M_string_length + lVar20) == 0) {
            prefix = "$p";
            if (((ulong)((long)(pFVar11->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar11->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar19) {
              prefix = "$l";
            }
            local_60 = (undefined1  [8])&new_name._M_string_length;
            new_name._M_dataplus._M_p = (pointer)0x0;
            new_name._M_string_length = new_name._M_string_length & 0xffffffffffffff00;
            anon_unknown_16::NameGenerator::GenerateAndBindName
                      (&pFVar11->bindings,prefix,(Index)uVar19,(string *)local_60);
            std::__cxx11::string::_M_assign
                      ((string *)((long)&((_Alloc_hider *)auStack_88)->_M_p + lVar20),
                       (string *)local_60);
            auVar12 = auStack_88;
            pbVar15 = index_to_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_60 != (undefined1  [8])&new_name._M_string_length) {
              operator_delete((void *)local_60);
              auVar12 = auStack_88;
              pbVar15 = index_to_name.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 0x20;
        } while (uVar19 < (ulong)((long)pbVar15 - (long)auVar12 >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_88);
      generator.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)generator.visitor_.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000)
      ;
      RVar9 = ExprVisitor::VisitFunc((ExprVisitor *)&generator.module_,pFVar11);
      lVar20 = generator._112_8_;
      if (RVar9.enum_ == Error) break;
      uVar18 = (ulong)((Index)uVar18 + 1);
      lVar13 = *(long *)(generator._112_8_ + 0x88);
    } while (uVar18 < (ulong)(*(long *)(generator._112_8_ + 0x90) - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x100);
  lVar16 = *(long *)(lVar20 + 0x108);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290),"$T",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0x100);
        lVar16 = *(long *)(lVar20 + 0x108);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x130);
  lVar16 = *(long *)(lVar20 + 0x138);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8),"$M",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0x130);
        lVar16 = *(long *)(lVar20 + 0x138);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x70);
  lVar16 = *(long *)(lVar20 + 0x78);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178),"$e",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0x70);
        lVar16 = *(long *)(lVar20 + 0x78);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x148);
  lVar16 = *(long *)(lVar20 + 0x150);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x300),"$d",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0x148);
        lVar16 = *(long *)(lVar20 + 0x150);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  lVar13 = *(long *)(lVar20 + 0x118);
  lVar16 = *(long *)(lVar20 + 0x120);
  if (lVar16 != lVar13) {
    uVar18 = 0;
    do {
      psVar4 = *(string **)(lVar13 + uVar18 * 8);
      if (psVar4->_M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x338),"$e",
                   (Index)uVar18,psVar4);
        lVar13 = *(long *)(lVar20 + 0x118);
        lVar16 = *(long *)(lVar20 + 0x120);
      }
      uVar18 = (ulong)((Index)uVar18 + 1);
    } while (uVar18 < (ulong)(lVar16 - lVar13 >> 3));
  }
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  local_108._vptr_Delegate = (_func_int **)&PTR__NameGenerator_01545f28;
  if (generator.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(generator.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (generator.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(generator.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (generator.visitor_.delegate_ != (Delegate *)0x0) {
    operator_delete(generator.visitor_.delegate_);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module) {
  NameGenerator generator;
  return generator.VisitModule(module);
}